

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_arithmetic<mserialize::detail::IntegerToHex,binlog::Range>
               (char tag,IntegerToHex *visitor,Range *istream)

{
  char cVar1;
  short v;
  long v_00;
  bool bVar2;
  char *pcVar3;
  runtime_error *this;
  byte bVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar8 = (int)CONCAT71(in_register_00000039,tag);
  if (0x61 < iVar8) {
    switch(iVar8) {
    case 0x62:
      binlog::Range::throw_if_overflow(istream,1);
      cVar1 = *istream->_begin;
      istream->_begin = istream->_begin + 1;
      pcVar3 = write_integer_as_hex<signed_char>(cVar1,visitor->_buffer + 0x13);
      break;
    case 99:
      binlog::Range::throw_if_overflow(istream,1);
      cVar1 = *istream->_begin;
      istream->_begin = istream->_begin + 1;
      pcVar3 = write_integer_as_hex<char>(cVar1,visitor->_buffer + 0x13);
      break;
    case 100:
      binlog::Range::throw_if_overflow(istream,8);
      istream->_begin = istream->_begin + 8;
      return;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_001137b4_caseD_65:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid arithmetic tag: ","");
      std::operator+(&local_48,&local_68,tag);
      std::runtime_error::runtime_error(this,(string *)&local_48);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x66:
      binlog::Range::throw_if_overflow(istream,4);
      istream->_begin = istream->_begin + 4;
      return;
    case 0x69:
      binlog::Range::throw_if_overflow(istream,4);
      iVar8 = *(int *)istream->_begin;
      istream->_begin = (char *)((long)istream->_begin + 4);
      pcVar3 = write_integer_as_hex<int>(iVar8,visitor->_buffer + 0x13);
      break;
    case 0x6c:
      binlog::Range::throw_if_overflow(istream,8);
      v_00 = *(long *)istream->_begin;
      istream->_begin = (char *)((long)istream->_begin + 8);
      pcVar3 = write_integer_as_hex<long>(v_00,visitor->_buffer + 0x13);
      break;
    default:
      if (iVar8 == 0x73) {
        binlog::Range::throw_if_overflow(istream,2);
        v = *(short *)istream->_begin;
        istream->_begin = (char *)((long)istream->_begin + 2);
        pcVar3 = write_integer_as_hex<short>(v,visitor->_buffer + 0x13);
      }
      else {
        if (iVar8 != 0x79) goto switchD_001137b4_caseD_65;
        binlog::Range::throw_if_overflow(istream,1);
        bVar4 = *istream->_begin;
        istream->_begin = istream->_begin + 1;
        pcVar3 = visitor->_buffer + 0x12;
        visitor->_buffer[0x12] = bVar4 & 1 | 0x30;
      }
    }
    goto LAB_00113a7b;
  }
  if (iVar8 < 0x49) {
    if (iVar8 != 0x42) {
      if (iVar8 == 0x44) {
        binlog::Range::throw_if_overflow(istream,0x10);
        istream->_begin = istream->_begin + 0x10;
        return;
      }
      goto switchD_001137b4_caseD_65;
    }
    binlog::Range::throw_if_overflow(istream,1);
    bVar4 = *istream->_begin;
    istream->_begin = istream->_begin + 1;
    if (bVar4 != 0) {
      pcVar3 = visitor->_buffer + 0x13;
      do {
        pcVar3[-1] = "0123456789ABCDEF"[bVar4 & 0xf];
        pcVar3 = pcVar3 + -1;
        bVar2 = 0xf < bVar4;
        bVar4 = bVar4 >> 4;
      } while (bVar2);
      goto LAB_00113a7b;
    }
LAB_00113a73:
    pcVar3 = visitor->_buffer + 0x12;
    visitor->_buffer[0x12] = '0';
LAB_00113a7b:
    visitor->_p = pcVar3;
    return;
  }
  if (iVar8 == 0x49) {
    binlog::Range::throw_if_overflow(istream,4);
    uVar5 = *(uint *)istream->_begin;
    istream->_begin = (char *)((long)istream->_begin + 4);
    if (uVar5 != 0) {
      pcVar3 = visitor->_buffer + 0x13;
      do {
        pcVar3[-1] = "0123456789ABCDEF"[uVar5 & 0xf];
        pcVar3 = pcVar3 + -1;
        bVar2 = 0xf < uVar5;
        uVar5 = uVar5 >> 4;
      } while (bVar2);
      goto LAB_00113a6d;
    }
  }
  else {
    if (iVar8 != 0x4c) {
      if (iVar8 != 0x53) goto switchD_001137b4_caseD_65;
      binlog::Range::throw_if_overflow(istream,2);
      uVar6 = *(ushort *)istream->_begin;
      istream->_begin = (char *)((long)istream->_begin + 2);
      if (uVar6 != 0) {
        pcVar3 = visitor->_buffer + 0x13;
        uVar5 = (uint)uVar6;
        do {
          pcVar3[-1] = "0123456789ABCDEF"[uVar5 & 0xf];
          pcVar3 = pcVar3 + -1;
          uVar6 = (ushort)uVar5;
          uVar5 = uVar5 >> 4;
        } while (0xf < uVar6);
        goto LAB_00113a7b;
      }
      goto LAB_00113a73;
    }
    binlog::Range::throw_if_overflow(istream,8);
    uVar7 = *(ulong *)istream->_begin;
    istream->_begin = (char *)((long)istream->_begin + 8);
    if (uVar7 != 0) {
      pcVar3 = visitor->_buffer + 0x13;
      do {
        pcVar3[-1] = "0123456789ABCDEF"[(uint)uVar7 & 0xf];
        pcVar3 = pcVar3 + -1;
        bVar2 = 0xf < uVar7;
        uVar7 = uVar7 >> 4;
      } while (bVar2);
      goto LAB_00113a6d;
    }
  }
  pcVar3 = visitor->_buffer + 0x12;
  visitor->_buffer[0x12] = '0';
LAB_00113a6d:
  visitor->_p = pcVar3;
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}